

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

Vec_Wrd_t * Lms_GiaDelays(Gia_Man_t *p)

{
  ulong uVar1;
  Vec_Wrd_t *p_00;
  word *pwVar2;
  ulong uVar3;
  Vec_Wrd_t *p_01;
  byte bVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  word Entry;
  uint uVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar20;
  int iVar21;
  undefined1 auVar19 [16];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar25;
  ulong uVar27;
  undefined1 auVar26 [16];
  
  iVar18 = p->nObjs;
  p_00 = (Vec_Wrd_t *)malloc(0x10);
  iVar21 = 0x10;
  if (0xe < iVar18 - 1U) {
    iVar21 = iVar18;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar21;
  if (iVar21 == 0) {
    pwVar2 = (word *)0x0;
  }
  else {
    pwVar2 = (word *)malloc((long)iVar21 << 3);
  }
  p_00->pArray = pwVar2;
  Vec_WrdPush(p_00,0);
  if (1 < p->nObjs) {
    lVar11 = 1;
    do {
      uVar1 = *(ulong *)(p->pObjs + lVar11);
      uVar6 = (uint)uVar1;
      iVar18 = (int)lVar11;
      uVar7 = (uint)(uVar1 >> 0x20);
      if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar6 < 0) {
        if ((int)uVar6 < 0 && (int)(uVar1 & 0x1fffffff) != 0x1fffffff) {
          uVar6 = iVar18 - (uVar6 & 0x1fffffff);
          if (((int)uVar6 < 0) || (p_00->nSize <= (int)uVar6)) goto LAB_002f5c34;
          iVar18 = p->vCis->nSize;
          if ((long)iVar18 < 1) goto LAB_002f5b10;
          if (iVar18 - 0x11U < 0xfffffff0) goto LAB_002f5c72;
          uVar3 = (ulong)(iVar18 + 1U & 0x3e);
          lVar5 = (long)iVar18 + -1;
          auVar12._8_4_ = (int)lVar5;
          auVar12._0_8_ = lVar5;
          auVar12._12_4_ = (int)((ulong)lVar5 >> 0x20);
          uVar1 = p_00->pArray[uVar6];
          auVar19._8_4_ = (int)uVar1;
          auVar19._0_8_ = uVar1;
          auVar19._12_4_ = (int)(uVar1 >> 0x20);
          auVar17 = (undefined1  [16])0x0;
          auVar23 = _DAT_0093d210;
          do {
            auVar13 = auVar23;
            auVar16 = auVar17;
            lVar5 = auVar13._0_8_ << 2;
            lVar25 = auVar13._8_8_ << 2;
            uVar15 = uVar1 >> lVar5;
            uVar27 = auVar19._8_8_ >> lVar25;
            auVar17._0_4_ = -(uint)((uVar15 & 0xf) == 0);
            auVar17._4_4_ = -(uint)((uVar15 & 0xf) == 0);
            auVar17._8_4_ = -(uint)((uVar27 & 0xf) == 0);
            auVar17._12_4_ = -(uint)((uVar27 & 0xf) == 0);
            auVar26._8_8_ = (ulong)(((uint)uVar27 & 0xf) - 1) << lVar25;
            auVar26._0_8_ = (ulong)(((uint)uVar15 & 0xf) - 1) << lVar5;
            auVar17 = ~auVar17 & auVar26 | auVar16;
            auVar23._0_8_ = auVar13._0_8_ + 2;
            auVar23._8_8_ = auVar13._8_8_ + 2;
            uVar3 = uVar3 - 2;
          } while (uVar3 != 0);
          auVar12 = auVar12 ^ _DAT_0093d220;
          auVar13 = auVar13 ^ _DAT_0093d220;
          iVar18 = -(uint)(auVar12._0_4_ < auVar13._0_4_);
          iVar20 = -(uint)(auVar12._4_4_ < auVar13._4_4_);
          iVar21 = -(uint)(auVar12._8_4_ < auVar13._8_4_);
          iVar22 = -(uint)(auVar12._12_4_ < auVar13._12_4_);
          auVar24._4_4_ = iVar18;
          auVar24._0_4_ = iVar18;
          auVar24._8_4_ = iVar21;
          auVar24._12_4_ = iVar21;
          iVar18 = -(uint)(auVar13._4_4_ == auVar12._4_4_);
          iVar21 = -(uint)(auVar13._12_4_ == auVar12._12_4_);
          auVar13._4_4_ = iVar18;
          auVar13._0_4_ = iVar18;
          auVar13._8_4_ = iVar21;
          auVar13._12_4_ = iVar21;
          auVar14._4_4_ = iVar20;
          auVar14._0_4_ = iVar20;
          auVar14._8_4_ = iVar22;
          auVar14._12_4_ = iVar22;
          auVar14 = auVar14 | auVar13 & auVar24;
          auVar17 = ~auVar14 & auVar17 | auVar16 & auVar14;
          Entry = auVar17._8_8_ | auVar17._0_8_;
        }
        else {
          if ((~uVar6 & 0x9fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0xae,"Vec_Wrd_t *Lms_GiaDelays(Gia_Man_t *)");
          }
          if (-1 < (int)uVar6) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          uVar7 = uVar7 & 0x1fffffff;
          if (0xf < uVar7) {
            __assert_fail("v >= 0 && v < LMS_VAR_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x73,"word Lms_DelayInit(int)");
          }
          Entry = 1L << ((byte)(uVar7 << 2) & 0x3f);
        }
      }
      else {
        uVar6 = iVar18 - (uVar6 & 0x1fffffff);
        if (((((int)uVar6 < 0) || (p_00->nSize <= (int)uVar6)) ||
            (uVar7 = iVar18 - (uVar7 & 0x1fffffff), (int)uVar7 < 0)) || ((uint)p_00->nSize <= uVar7)
           ) goto LAB_002f5c34;
        iVar18 = p->vCis->nSize;
        if ((long)iVar18 < 1) {
LAB_002f5b10:
          Entry = 0;
        }
        else {
          if (iVar18 - 0x11U < 0xfffffff0) {
LAB_002f5c72:
            __assert_fail("v >= 0 && v < LMS_VAR_MAX",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0x71,"int Lms_DelayGet(word, int)");
          }
          lVar5 = 0;
          Entry = 0;
          do {
            bVar4 = (byte)lVar5;
            uVar9 = (uint)(p_00->pArray[uVar6] >> (bVar4 & 0x3f)) & 0xf;
            uVar8 = (uint)(p_00->pArray[uVar7] >> (bVar4 & 0x3f)) & 0xf;
            if (uVar8 < uVar9) {
              uVar8 = uVar9;
            }
            if (uVar8 != 0) {
              if (0xd < uVar8) {
                uVar8 = 0xe;
              }
              Entry = Entry | (ulong)uVar8 + 1 << (bVar4 & 0x3f);
            }
            lVar5 = lVar5 + 4;
          } while ((long)iVar18 * 4 != lVar5);
        }
      }
      Vec_WrdPush(p_00,Entry);
      lVar11 = lVar11 + 1;
    } while (lVar11 < p->nObjs);
  }
  pVVar10 = p->vCos;
  iVar18 = pVVar10->nSize;
  p_01 = (Vec_Wrd_t *)malloc(0x10);
  iVar21 = 0x10;
  if (0xe < iVar18 - 1U) {
    iVar21 = iVar18;
  }
  p_01->nSize = 0;
  p_01->nCap = iVar21;
  if (iVar21 == 0) {
    pwVar2 = (word *)0x0;
  }
  else {
    pwVar2 = (word *)malloc((long)iVar21 << 3);
  }
  p_01->pArray = pwVar2;
  if (0 < iVar18) {
    lVar11 = 0;
    do {
      iVar18 = pVVar10->pArray[lVar11];
      if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (p_00->nSize <= iVar18) {
LAB_002f5c34:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      Vec_WrdPush(p_01,p_00->pArray[iVar18]);
      lVar11 = lVar11 + 1;
      pVVar10 = p->vCos;
    } while (lVar11 < pVVar10->nSize);
  }
  if (p_00->pArray != (word *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return p_01;
}

Assistant:

Vec_Wrd_t * Lms_GiaDelays( Gia_Man_t * p )
{
    Vec_Wrd_t * vDelays, * vResult;
    Gia_Obj_t * pObj;
    int i;
    // compute delay profiles of all objects
    vDelays = Vec_WrdAlloc( Gia_ManObjNum(p) );
    Vec_WrdPush( vDelays, 0 ); // const 0
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayMax( Vec_WrdEntry(vDelays, Gia_ObjFaninId0(pObj, i)), Vec_WrdEntry(vDelays, Gia_ObjFaninId1(pObj, i)), Gia_ManCiNum(p) ) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayDecrement( Vec_WrdEntry(vDelays, Gia_ObjFaninId0(pObj, i)), Gia_ManCiNum(p) ) );
        else if ( Gia_ObjIsCi(pObj) )
            Vec_WrdPush( vDelays, Lms_DelayInit( Gia_ObjCioId(pObj) ) );
        else assert( 0 );
    }
    // collect delay profiles of COs only
    vResult = Vec_WrdAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_WrdPush( vResult, Vec_WrdEntry(vDelays, Gia_ObjId(p, pObj)) );
    Vec_WrdFree( vDelays );
    return vResult;
}